

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractbutton.cpp
# Opt level: O3

void QAbstractButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  code *pcVar4;
  byte bVar5;
  QSize QVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  QSize *pQVar10;
  long in_FS_OFFSET;
  undefined1 checked;
  QSize local_30;
  QSize local_28;
  QSize *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        iVar9 = 0;
LAB_003bf5d9:
        QMetaObject::activate(_o,&staticMetaObject,iVar9,(void **)0x0);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        iVar9 = 1;
        goto LAB_003bf5d9;
      }
      break;
    case 2:
      local_30.wd.m_i._0_1_ = *_a[1];
      goto LAB_003bf583;
    case 3:
      local_30 = (QSize)((ulong)(uint7)local_30._1_7_ << 8);
LAB_003bf583:
      iVar9 = 2;
LAB_003bf58f:
      local_20 = &local_30;
      local_28.wd.m_i = 0;
      local_28.ht.m_i = 0;
      QMetaObject::activate(_o,&staticMetaObject,iVar9,(void **)&local_28);
      goto switchD_003bf38c_caseD_3;
    case 4:
      local_30.wd.m_i._0_1_ = *_a[1];
      iVar9 = 4;
      goto LAB_003bf58f;
    case 5:
      pQVar10 = (QSize *)_a[1];
switchD_003bf3e9_caseD_2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setIconSize((QAbstractButton *)_o,pQVar10);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        animateClick((QAbstractButton *)_o);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        click((QAbstractButton *)_o);
        return;
      }
      break;
    case 8:
      checked = (*(byte *)(*(long *)(_o + 8) + 0x28c) & 2) == 0;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_003bf72b;
    case 9:
      checked = *_a[1];
LAB_003bf714:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_003bf72b:
        setChecked((QAbstractButton *)_o,(bool)checked);
        return;
      }
      break;
    default:
      goto switchD_003bf38c_caseD_3;
    }
    goto LAB_003bf863;
  case ReadProperty:
    if (10 < (uint)_id) goto switchD_003bf38c_caseD_3;
    break;
  case WriteProperty:
    if (10 < (uint)_id) goto switchD_003bf38c_caseD_3;
    pQVar10 = (QSize *)*_a;
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setText((QAbstractButton *)_o,(QString *)pQVar10);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setIcon((QAbstractButton *)_o,(QIcon *)pQVar10);
        return;
      }
      break;
    case 2:
      goto switchD_003bf3e9_caseD_2;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setShortcut((QAbstractButton *)_o,(QKeySequence *)pQVar10);
        return;
      }
      break;
    case 4:
      bVar5 = (byte)(pQVar10->wd).m_i;
      lVar7 = *(long *)(_o + 8);
      if (((*(byte *)(lVar7 + 0x28c) ^ bVar5) & 1) != 0) {
        bVar8 = *(byte *)(lVar7 + 0x28c) & 0xfc;
        goto LAB_003bf6e9;
      }
      goto switchD_003bf38c_caseD_3;
    case 5:
      checked = (undefined1)(pQVar10->wd).m_i;
      goto LAB_003bf714;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setAutoRepeat((QAbstractButton *)_o,SUB41((pQVar10->wd).m_i,0));
        return;
      }
      break;
    case 7:
      lVar7 = *(long *)(_o + 8);
      bVar5 = (char)(pQVar10->wd).m_i << 3;
      bVar8 = *(byte *)(lVar7 + 0x28c) & 0xf7;
LAB_003bf6e9:
      *(byte *)(lVar7 + 0x28c) = bVar8 | bVar5;
      goto switchD_003bf38c_caseD_3;
    case 8:
      *(int *)(*(long *)(_o + 8) + 0x2a0) = (pQVar10->wd).m_i;
      goto switchD_003bf38c_caseD_3;
    case 9:
      *(int *)(*(long *)(_o + 8) + 0x2a4) = (pQVar10->wd).m_i;
      goto switchD_003bf38c_caseD_3;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setDown((QAbstractButton *)_o,SUB41((pQVar10->wd).m_i,0));
        return;
      }
    }
    goto LAB_003bf863;
  default:
    goto switchD_003bf38c_caseD_3;
  case IndexOfMethod:
    pcVar4 = *_a[1];
    lVar7 = *(long *)((long)_a[1] + 8);
    if (pcVar4 == pressed && lVar7 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar4 == released && lVar7 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar4 == clicked && lVar7 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar4 == toggled && lVar7 == 0) {
      *(undefined4 *)*_a = 4;
    }
    goto switchD_003bf38c_caseD_3;
  }
  pQVar10 = (QSize *)*_a;
  switch(_id) {
  case 0:
    lVar7 = *(long *)(_o + 8);
    QVar6 = *(QSize *)(lVar7 + 600);
    QVar1 = *(QSize *)(lVar7 + 0x260);
    QVar2 = *(QSize *)(lVar7 + 0x268);
    if (QVar6 != (QSize)0x0) {
      LOCK();
      *(int *)QVar6 = *(int *)QVar6 + 1;
      UNLOCK();
    }
    QVar3 = *pQVar10;
    *pQVar10 = QVar6;
    pQVar10[1] = QVar1;
    pQVar10[2] = QVar2;
    if (QVar3 != (QSize)0x0) {
      LOCK();
      *(int *)QVar3 = *(int *)QVar3 + -1;
      UNLOCK();
      if (*(int *)QVar3 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QArrayData::deallocate((QArrayData *)QVar3,2,0x10);
          return;
        }
        goto LAB_003bf863;
      }
    }
    break;
  case 1:
    QIcon::QIcon((QIcon *)&local_30,(QIcon *)(*(long *)(_o + 8) + 0x270));
    QVar6 = local_30;
    local_30.wd.m_i = 0;
    local_30.ht.m_i = 0;
    local_28 = *pQVar10;
    *pQVar10 = QVar6;
    QIcon::~QIcon((QIcon *)&local_28);
    QIcon::~QIcon((QIcon *)&local_30);
    break;
  case 2:
    QVar6 = iconSize((QAbstractButton *)_o);
    *pQVar10 = QVar6;
    break;
  case 3:
    QKeySequence::QKeySequence
              ((QKeySequence *)&local_28,(QKeySequence *)(*(long *)(_o + 8) + 0x280));
    QVar6 = *pQVar10;
    *pQVar10 = local_28;
    local_28 = QVar6;
    QKeySequence::~QKeySequence((QKeySequence *)&local_28);
    break;
  case 4:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c);
    goto LAB_003bf837;
  case 5:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 1;
    goto LAB_003bf837;
  case 6:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 2;
    goto LAB_003bf837;
  case 7:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 3;
    goto LAB_003bf837;
  case 8:
    iVar9 = *(int *)(*(long *)(_o + 8) + 0x2a0);
    goto LAB_003bf848;
  case 9:
    iVar9 = *(int *)(*(long *)(_o + 8) + 0x2a4);
LAB_003bf848:
    (pQVar10->wd).m_i = iVar9;
    break;
  case 10:
    bVar5 = *(byte *)(*(long *)(_o + 8) + 0x28c) >> 4;
LAB_003bf837:
    *(byte *)&(pQVar10->wd).m_i = bVar5 & 1;
  }
switchD_003bf38c_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003bf863:
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractButton *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed(); break;
        case 1: _t->released(); break;
        case 2: _t->clicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->clicked(); break;
        case 4: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 6: _t->animateClick(); break;
        case 7: _t->click(); break;
        case 8: _t->toggle(); break;
        case 9: _t->setChecked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)()>(_a, &QAbstractButton::released, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::clicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractButton::*)(bool )>(_a, &QAbstractButton::toggled, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 3: *reinterpret_cast<QKeySequence*>(_v) = _t->shortcut(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isCheckable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isChecked(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->autoRepeat(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->autoExclusive(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->autoRepeatDelay(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->autoRepeatInterval(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isDown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setShortcut(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 4: _t->setCheckable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setChecked(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAutoRepeat(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAutoExclusive(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoRepeatDelay(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setAutoRepeatInterval(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setDown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}